

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

group * clipp::operator_(parameter *a,group *b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  ulong uVar5;
  group *in_RDX;
  parameter *in_RSI;
  group *in_RDI;
  parameter *in_stack_fffffffffffffde8;
  parameter *in_stack_fffffffffffffdf0;
  group *in_stack_fffffffffffffdf8;
  group *in_stack_fffffffffffffe00;
  parameter *in_stack_fffffffffffffe08;
  group *in_stack_fffffffffffffe10;
  group local_1b0;
  byte local_161;
  group local_160 [3];
  group local_60;
  
  bVar3 = group::scoped(in_RDX);
  local_161 = 0;
  bVar2 = false;
  bVar1 = false;
  if ((((bVar3) || (bVar3 = group::blocking(in_stack_fffffffffffffe00), bVar3)) ||
      (bVar3 = group::exclusive(in_RDX), bVar3)) ||
     ((bVar3 = detail::token<clipp::group>::repeatable(&in_RDX->super_token<clipp::group>), bVar3 ||
      (bVar3 = group::joinable(in_RDX), bVar3)))) {
LAB_0017f2d1:
    in_stack_fffffffffffffdf8 = local_160;
    parameter::parameter(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    local_161 = 1;
    in_stack_fffffffffffffe00 = &local_1b0;
    group::group((group *)in_stack_fffffffffffffdf0,(group *)in_stack_fffffffffffffde8);
    bVar2 = true;
    group::group<clipp::group>(in_RDX,in_RSI,in_stack_fffffffffffffe10);
    bVar1 = true;
    in_stack_fffffffffffffdf0 = (parameter *)group::scoped(&local_60,false);
  }
  else {
    detail::token<clipp::group>::doc_abi_cxx11_(&in_RDX->super_token<clipp::group>);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      in_stack_fffffffffffffe10 =
           (group *)detail::token<clipp::group>::doc_abi_cxx11_(&in_RDX->super_token<clipp::group>);
      detail::token<clipp::parameter>::doc_abi_cxx11_(&in_RSI->super_token<clipp::parameter>);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe10,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe08);
      if (!_Var4) goto LAB_0017f2d1;
    }
    group::push_front(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  group::group(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (bVar1) {
    group::~group((group *)in_stack_fffffffffffffdf0);
  }
  if (bVar2) {
    group::~group((group *)in_stack_fffffffffffffdf0);
  }
  if ((local_161 & 1) != 0) {
    parameter::~parameter(in_stack_fffffffffffffdf0);
  }
  return in_RDI;
}

Assistant:

inline group
operator , (parameter a, group b)
{
    return !b.scoped() && !b.blocking() && !b.exclusive() && !b.repeatable()
        && !b.joinable() && (b.doc().empty() || b.doc() == a.doc())
       ? b.push_front(std::move(a))
       : group{std::move(a), std::move(b)}.scoped(false);
}